

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

Value * __thiscall
Json::ValueIteratorBase::key(Value *__return_storage_ptr__,ValueIteratorBase *this)

{
  bool bVar1;
  reference other;
  char *pcVar2;
  int __c;
  StaticString local_40 [3];
  undefined1 local_28 [8];
  CZString czstring;
  ValueIteratorBase *this_local;
  
  czstring._8_8_ = this;
  other = std::_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::operator*
                    (&this->current_);
  Value::CZString::CZString((CZString *)local_28,&other->first);
  pcVar2 = Value::CZString::c_str((CZString *)local_28);
  if (pcVar2 == (char *)0x0) {
    pcVar2 = Value::CZString::index((CZString *)local_28,(char *)other,__c);
    Value::Value(__return_storage_ptr__,(UInt)pcVar2);
  }
  else {
    bVar1 = Value::CZString::isStaticString((CZString *)local_28);
    if (bVar1) {
      pcVar2 = Value::CZString::c_str((CZString *)local_28);
      StaticString::StaticString(local_40,pcVar2);
      Value::Value(__return_storage_ptr__,local_40);
    }
    else {
      pcVar2 = Value::CZString::c_str((CZString *)local_28);
      Value::Value(__return_storage_ptr__,pcVar2);
    }
  }
  Value::CZString::~CZString((CZString *)local_28);
  return __return_storage_ptr__;
}

Assistant:

Value ValueIteratorBase::key() const {
#ifndef JSON_VALUE_USE_INTERNAL_MAP
  const Value::CZString czstring = (*current_).first;
  if (czstring.c_str()) {
    if (czstring.isStaticString())
      return Value(StaticString(czstring.c_str()));
    return Value(czstring.c_str());
  }
  return Value(czstring.index());
#else
  if (isArray_)
    return Value(ValueInternalArray::indexOf(iterator_.array_));
  bool isStatic;
  const char* memberName = ValueInternalMap::key(iterator_.map_, isStatic);
  if (isStatic)
    return Value(StaticString(memberName));
  return Value(memberName);
#endif
}